

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsViewPrivate::centerView(QGraphicsViewPrivate *this,ViewportAnchor anchor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QGraphicsView *this_00;
  QWidgetData *pQVar5;
  QWidget *this_01;
  undefined8 uVar6;
  long in_FS_OFFSET;
  int iVar11;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  QPointF QVar9;
  QPointF QVar10;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if (anchor == AnchorViewCenter) {
LAB_0062ce18:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QGraphicsView::centerOn(this_00,&this->lastCenterPoint);
      return;
    }
  }
  else {
    if (anchor == AnchorUnderMouse) {
      if ((*(byte *)(*(long *)(this_00 + 0x20) + 8) & 2) == 0) goto LAB_0062ce18;
      pQVar5 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      uVar1 = (pQVar5->crect).x2;
      uVar3 = (pQVar5->crect).y2;
      uVar2 = (pQVar5->crect).x1;
      uVar4 = (pQVar5->crect).y1;
      iVar11 = uVar1 - uVar2;
      auVar7._4_4_ = uVar3 - uVar4;
      auVar7._8_4_ = auVar7._4_4_;
      auVar7._12_4_ = -(uint)(auVar7._4_4_ < 0);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      local_38.xp = (double)(CONCAT44(-(uint)(iVar11 < 0),iVar11) + 1) * 0.5 + 0.0;
      local_38.yp = (double)(auVar7._8_8_ - auVar8._8_8_) * 0.5 + 0.0;
      QVar9 = mapToScene(this,&local_38);
      this_01 = (this->super_QAbstractScrollAreaPrivate).viewport;
      uVar6 = QCursor::pos();
      local_58.xp = (qreal)(int)uVar6;
      local_58.yp = (qreal)(int)((ulong)uVar6 >> 0x20);
      local_48 = QWidget::mapFromGlobal(this_01,&local_58);
      QVar10 = mapToScene(this,&local_48);
      local_38.xp = (this->lastMouseMoveScenePoint).xp + (QVar9.xp - QVar10.xp);
      local_38.yp = (this->lastMouseMoveScenePoint).yp + (QVar9.yp - QVar10.yp);
      QGraphicsView::centerOn(this_00,&local_38);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::centerView(QGraphicsView::ViewportAnchor anchor)
{
    Q_Q(QGraphicsView);
    switch (anchor) {
    case QGraphicsView::AnchorUnderMouse: {
        if (q->underMouse()) {
            // Last scene pos: lastMouseMoveScenePoint
            // Current mouse pos:
            QPointF transformationDiff = mapToScene(viewport->rect().toRectF().center())
                                         - mapToScene(viewport->mapFromGlobal(QCursor::pos().toPointF()));
            q->centerOn(lastMouseMoveScenePoint + transformationDiff);
        } else {
            q->centerOn(lastCenterPoint);
        }
        break;
    }
    case QGraphicsView::AnchorViewCenter:
        q->centerOn(lastCenterPoint);
        break;
    case QGraphicsView::NoAnchor:
        break;
    }
}